

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::computeGregorianAndDOWFields(Calendar *this,int32_t julianDay,UErrorCode *ec)

{
  byte bVar1;
  EDaysOfWeek EVar2;
  int iVar3;
  int32_t local_28;
  int32_t dowLocal;
  int32_t dow;
  UErrorCode *ec_local;
  int32_t julianDay_local;
  Calendar *this_local;
  
  computeGregorianFields(this,julianDay,ec);
  bVar1 = julianDayToDayOfWeek((double)julianDay);
  internalSet(this,UCAL_DAY_OF_WEEK,(uint)bVar1);
  EVar2 = getFirstDayOfWeek(this);
  iVar3 = bVar1 - EVar2;
  local_28 = iVar3 + 1;
  if (local_28 < 1) {
    local_28 = iVar3 + 8;
  }
  internalSet(this,UCAL_DOW_LOCAL,local_28);
  this->fFields[0x12] = local_28;
  return;
}

Assistant:

void Calendar::computeGregorianAndDOWFields(int32_t julianDay, UErrorCode &ec)
{
    computeGregorianFields(julianDay, ec);

    // Compute day of week: JD 0 = Monday
    int32_t dow = julianDayToDayOfWeek(julianDay);
    internalSet(UCAL_DAY_OF_WEEK,dow);

    // Calculate 1-based localized day of week
    int32_t dowLocal = dow - getFirstDayOfWeek() + 1;
    if (dowLocal < 1) {
        dowLocal += 7;
    }
    internalSet(UCAL_DOW_LOCAL,dowLocal);
    fFields[UCAL_DOW_LOCAL] = dowLocal;
}